

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O1

int cvDoProjection(CVodeMem cv_mem,int *nflagPtr,realtype saved_t,int *npfailPtr)

{
  int iVar1;
  CVodeProjMem pCVar2;
  N_Vector p_Var3;
  int iVar4;
  N_Vector z;
  realtype rVar5;
  double dVar6;
  double dVar7;
  
  pCVar2 = cv_mem->proj_mem;
  if (pCVar2 == (CVodeProjMem)0x0) {
    iVar4 = -0x1d;
    cvProcessError(cv_mem,-0x1d,"CVODE","cvDoProjection","proj_mem = NULL illegal.");
  }
  else {
    if (pCVar2->err_proj == 0) {
      z = (N_Vector)0x0;
    }
    else {
      z = cv_mem->cv_ftemp;
    }
    p_Var3 = cv_mem->cv_tempv;
    if (pCVar2->err_proj != 0) {
      N_VScale(1.0,cv_mem->cv_acor,z);
    }
    iVar4 = (*pCVar2->pfun)(cv_mem->cv_tn,cv_mem->cv_y,p_Var3,pCVar2->eps_proj,z,
                            cv_mem->cv_user_data);
    pCVar2->nproj = pCVar2->nproj + 1;
    pCVar2->first_proj = 0;
    if (iVar4 == 0) {
      if (pCVar2->err_proj != 0) {
        rVar5 = N_VWrmsNorm(z,cv_mem->cv_ewt);
        cv_mem->cv_acnrm = rVar5;
      }
      cv_mem->proj_applied = 1;
      iVar4 = 0;
    }
    else {
      pCVar2->npfails = pCVar2->npfails + 1;
      cvRestore(cv_mem,saved_t);
      if (iVar4 < 0) {
        iVar4 = -0x1e;
      }
      else {
        iVar1 = *npfailPtr;
        *npfailPtr = iVar1 + 1;
        cv_mem->cv_etamax = 1.0;
        if (ABS(cv_mem->cv_h) <= cv_mem->cv_hmin * 1.000001) {
          if (0 < iVar4) {
            return -0x1f;
          }
        }
        else if ((0 < iVar4) && (iVar1 + 1 == pCVar2->max_fails)) {
          return -0x1f;
        }
        dVar6 = cv_mem->cv_hmin / ABS(cv_mem->cv_h);
        dVar7 = pCVar2->eta_pfail;
        if (pCVar2->eta_pfail <= dVar6) {
          dVar7 = dVar6;
        }
        cv_mem->cv_eta = dVar7;
        *nflagPtr = 8;
        cvRescale(cv_mem);
        iVar4 = 3;
      }
    }
  }
  return iVar4;
}

Assistant:

int cvDoProjection(CVodeMem cv_mem, int *nflagPtr, realtype saved_t,
                   int *npfailPtr)
{
  int          retval;
  N_Vector     errP;
  N_Vector     acorP;
  CVodeProjMem proj_mem;

  /* Access projection memory */
  if (cv_mem->proj_mem == NULL) {
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, "CVODE",
                   "cvDoProjection", MSG_CV_PROJ_MEM_NULL);
    return(CV_PROJ_MEM_NULL);
  }
  proj_mem = cv_mem->proj_mem;

  /* Initialize return flag to success */
  retval = CV_SUCCESS;

  /* Use tempv to store acorP and, if projecting the error, ftemp to store
     errP (recall that in this case we did not allocate vectors to for
     acorP and errP). */
  acorP = cv_mem->cv_tempv;
  if (proj_mem->err_proj)
    errP = cv_mem->cv_ftemp;
  else
    errP = NULL;

  /* Copy acor into errP (if projecting the error) */
  if (proj_mem->err_proj) N_VScale(ONE, cv_mem->cv_acor, errP);

  /* Call the user projection function */
  retval = proj_mem->pfun(cv_mem->cv_tn, cv_mem->cv_y, acorP,
                          proj_mem->eps_proj, errP, cv_mem->cv_user_data);
  proj_mem->nproj++;

  /* This is not the first projection anymore */
  proj_mem->first_proj = SUNFALSE;

  /* Check the return value */
  if (retval == CV_SUCCESS)
  {
    /* Recompute acnrm to be used in error test (if projecting the error) */
    if (proj_mem->err_proj)
      cv_mem->cv_acnrm = N_VWrmsNorm(errP, cv_mem->cv_ewt);

    /* The projection was successful, return now */
    cv_mem->proj_applied = SUNTRUE;
    return(CV_SUCCESS);
  }

  /* The projection failed, update the return value */
  if (retval < 0) retval = CV_PROJFUNC_FAIL;
  if (retval > 0) retval = PROJFUNC_RECVR;

  /* Increment cumulative failure count and restore zn */
  proj_mem->npfails++;
  cvRestore(cv_mem, saved_t);

  /* Return if failed unrecoverably */
  if (retval == CV_PROJFUNC_FAIL) return(CV_PROJFUNC_FAIL);

  /* Recoverable failure, increment failure count for this step attempt */
  (*npfailPtr)++;
  cv_mem->cv_etamax = ONE;

  /* Check for maximum number of failures or |h| = hmin */
  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*npfailPtr == proj_mem->max_fails))
  {
    if (retval == PROJFUNC_RECVR) return(CV_REPTD_PROJFUNC_ERR);
  }

  /* Reduce step size; return to reattempt the step */
  cv_mem->cv_eta = SUNMAX(proj_mem->eta_pfail,
                          cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  *nflagPtr = PREV_PROJ_FAIL;
  cvRescale(cv_mem);

  return(PREDICT_AGAIN);
}